

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall sf::Shader::Shader(Shader *this)

{
  NonCopyable *in_RDI;
  
  GlResource::GlResource((GlResource *)0x20f888);
  NonCopyable::NonCopyable(in_RDI);
  *(undefined4 *)in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = 0xffffffff;
  memset(in_RDI + 8,0,0x30);
  std::
  map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
  ::map((map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
         *)0x20f8c5);
  memset(in_RDI + 0x38,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x20f8e9);
  return;
}

Assistant:

Shader::Shader() :
m_shaderProgram (0),
m_currentTexture(-1),
m_textures      (),
m_uniforms      ()
{
}